

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c219.c
# Opt level: O3

void c219_update(void *param,UINT32 samples,DEV_SMPL **outputs)

{
  size_t __n;
  byte bVar1;
  long lVar2;
  DEV_SMPL *pDVar3;
  DEV_SMPL *pDVar4;
  int iVar5;
  ushort uVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  ulong uVar10;
  uint uVar11;
  int iVar12;
  byte *pbVar13;
  short sVar14;
  byte bVar15;
  uint *puVar16;
  ulong uVar17;
  
  __n = (ulong)samples * 4;
  memset(*outputs,0,__n);
  memset(outputs[1],0,__n);
  lVar2 = *(long *)((long)param + 0x18);
  if (samples != 0 && lVar2 != 0) {
    pDVar3 = *outputs;
    pDVar4 = outputs[1];
    uVar10 = 0;
    do {
      uVar17 = 0;
      iVar12 = 0;
      iVar8 = 0;
      pbVar13 = (byte *)((long)param + 0x25);
      puVar16 = (uint *)((long)param + 0x424);
      do {
        if (((char)puVar16[6] != '\0') && (*(char *)((long)puVar16 + 0x19) == '\0')) {
          uVar11 = (uint)(ushort)puVar16[1] +
                   (uint)(ushort)(*(ushort *)(pbVar13 + -3) << 8 | *(ushort *)(pbVar13 + -3) >> 8);
          *(short *)(puVar16 + 1) = (short)uVar11;
          if (uVar11 < 0x10000) {
            uVar6 = *(ushort *)((long)puVar16 + 6);
            sVar14 = (short)puVar16[2];
            bVar15 = *pbVar13;
          }
          else {
            sVar14 = *(short *)((long)puVar16 + 6);
            *(short *)(puVar16 + 2) = sVar14;
            bVar15 = *pbVar13;
            if ((bVar15 & 4) == 0) {
              bVar1 = *(byte *)(lVar2 + (ulong)(((uint)*(byte *)((long)param +
                                                                (ulong)*(ushort *)
                                                                        ((long)&
                                                  find_sample_asic219banks +
                                                  (uVar17 >> 2 & 0x3fffffff) * 2) + 0x20) << 0x11 |
                                                *puVar16) & *(uint *)((long)param + 0x10)));
              if ((bVar15 & 1) == 0) {
                uVar6 = (ushort)bVar1 << 8;
              }
              else {
                uVar6 = *(ushort *)((long)param + (ulong)bVar1 * 2 + 0x222);
              }
              *(ushort *)((long)puVar16 + 6) = uVar6;
              uVar9 = *puVar16 + 1;
              *puVar16 = uVar9;
              if (uVar9 == puVar16[4]) {
                if ((bVar15 & 0x10) == 0) {
                  *(undefined1 *)(puVar16 + 6) = 0;
                  *(undefined2 *)((long)puVar16 + 6) = 0;
                  uVar6 = 0;
                }
                else {
                  *puVar16 = puVar16[5];
                }
              }
            }
            else {
              uVar6 = -(*(ushort *)((long)param + 0x220) & 1) & 0xfff6 ^
                      *(ushort *)((long)param + 0x220) >> 1;
              *(ushort *)((long)param + 0x220) = uVar6;
              *(ushort *)((long)puVar16 + 6) = uVar6;
            }
          }
          iVar7 = (int)((long)((int)(short)uVar6 - (int)sVar14) * (ulong)(uVar11 & 0xffff) >> 0x10)
                  + (int)sVar14;
          iVar5 = -iVar7;
          if ((bVar15 & 0x40) == 0) {
            iVar5 = iVar7;
          }
          iVar8 = iVar8 + (uint)pbVar13[-4] * iVar7;
          iVar12 = iVar12 + (uint)pbVar13[-5] * iVar5;
        }
        uVar17 = uVar17 + 1;
        puVar16 = puVar16 + 7;
        pbVar13 = pbVar13 + 0x10;
      } while (uVar17 != 0x10);
      pDVar3[uVar10] = pDVar3[uVar10] + (iVar8 >> 9);
      pDVar4[uVar10] = pDVar4[uVar10] + (iVar12 >> 9);
      uVar10 = uVar10 + 1;
    } while (uVar10 != samples);
  }
  return;
}

Assistant:

static void c219_update(void *param, UINT32 samples, DEV_SMPL **outputs)
{
	c219_state *chip = (c219_state *)param;
	UINT32 i, j;

	DEV_SMPL out[2];

	memset(outputs[0], 0, samples * sizeof(DEV_SMPL));
	memset(outputs[1], 0, samples * sizeof(DEV_SMPL));
	if (chip->pRom == NULL)
		return;

	for (i = 0; i < samples; i ++)
	{
		out[0] = out[1] = 0;

		for (j = 0; j < MAX_VOICE; j ++)
		{
			C219_VOICE* v = &chip->voi[j];
			const C219_VREGS* vreg = (C219_VREGS*)&chip->REG[j*16];

			if (v->key && ! v->Muted)
			{
				UINT32 frequency = (vreg->frequency_msb<<8) | vreg->frequency_lsb;
				INT32 newofs;
				INT32 s;

				newofs = v->pofs + frequency;
				v->pofs = newofs & 0xFFFF;
				if (newofs & 0x10000)
					c219_fetch_sample(chip, j);

				// Interpolate samples
				s = v->last_sample + (INT32)((INT64)v->pofs * (v->sample - v->last_sample) >> 16);

				if (vreg->mode & C219_MODE_INVERT)
					s = -s;
				out[0] += (((vreg->mode & C219_MODE_INVERT) ? -s : s) * vreg->volume_left);
				out[1] += (s * vreg->volume_right);
			}
		}

		outputs[0][i] += (out[0] >> 9);
		outputs[1][i] += (out[1] >> 9);
	}
}